

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::json_abi_v3_11_3::detail::
parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::parse(parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this,bool strict,
       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
       *result)

{
  size_t sVar1;
  json_value jVar2;
  token_type tVar3;
  data *this_00;
  json_sax_dom_callback_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  sdp;
  string local_1d0;
  string local_1b0;
  string local_190;
  undefined **local_170 [2];
  runtime_error local_160 [24];
  position_t local_148;
  _Any_data local_130;
  code *local_120;
  undefined1 local_110 [40];
  bool local_e8;
  bool local_e7;
  bool local_98;
  data local_58;
  data local_48;
  data local_38;
  
  if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
    local_e7 = this->allow_exceptions;
    local_110._8_8_ = (pointer)0x0;
    local_110._16_8_ = (pointer)0x0;
    local_110._24_8_ = (pointer)0x0;
    local_110._32_8_ =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_e8 = false;
    local_110._0_8_ = result;
    parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
    ::
    sax_parse_internal<nlohmann::json_abi_v3_11_3::detail::json_sax_dom_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>
              ((parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                *)this,(json_sax_dom_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)local_110);
    if (strict) {
      tVar3 = lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::scan(&this->m_lexer);
      this->last_token = tVar3;
      if (tVar3 != end_of_input) {
        sVar1 = (this->m_lexer).position.chars_read_total;
        lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_token_string(&local_190,&this->m_lexer);
        local_148.lines_read = (this->m_lexer).position.lines_read;
        local_148.chars_read_total._0_4_ = (undefined4)(this->m_lexer).position.chars_read_total;
        local_148.chars_read_total._4_4_ =
             *(undefined4 *)((long)&(this->m_lexer).position.chars_read_total + 4);
        local_148.chars_read_current_line._0_4_ =
             (undefined4)(this->m_lexer).position.chars_read_current_line;
        local_148.chars_read_current_line._4_4_ =
             *(undefined4 *)((long)&(this->m_lexer).position.chars_read_current_line + 4);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"value","");
        exception_message(&local_1b0,this,end_of_input,&local_1d0);
        parse_error::create<std::nullptr_t,_0>
                  ((parse_error *)local_170,0x65,&local_148,(string *)&local_1b0,(void *)0x0);
        json_sax_dom_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
        ::parse_error<nlohmann::json_abi_v3_11_3::detail::parse_error>
                  ((json_sax_dom_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    *)local_110,sVar1,(string *)&local_190,(parse_error *)local_170);
        local_170[0] = &PTR__exception_005453c0;
        std::runtime_error::~runtime_error
                  ((runtime_error *)((long)&((parse_error *)local_170)->super_exception + 0x10));
        std::exception::~exception((exception *)local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (local_e8 == true) {
      local_58.m_type = (result->m_data).m_type;
      (result->m_data).m_type = discarded;
      local_58.m_value = (result->m_data).m_value;
      (result->m_data).m_value.object = (object_t *)0x0;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_58);
    }
    if ((pointer)local_110._8_8_ == (pointer)0x0) {
      return;
    }
    operator_delete((void *)local_110._8_8_,local_110._24_8_ - local_110._8_8_);
    return;
  }
  CLI::std::
  function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  ::function((function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              *)&local_130,&this->callback);
  json_sax_dom_callback_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_sax_dom_callback_parser
            ((json_sax_dom_callback_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              *)local_110,result,(parser_callback_t *)&local_130,this->allow_exceptions);
  if (local_120 != (code *)0x0) {
    (*local_120)(&local_130,&local_130,__destroy_functor);
  }
  parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
  ::
  sax_parse_internal<nlohmann::json_abi_v3_11_3::detail::json_sax_dom_callback_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>
            ((parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
              *)this,(json_sax_dom_callback_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      *)local_110);
  if (strict) {
    tVar3 = lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::scan(&this->m_lexer);
    this->last_token = tVar3;
    if (tVar3 != end_of_input) {
      sVar1 = (this->m_lexer).position.chars_read_total;
      lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token_string(&local_190,&this->m_lexer);
      local_148.lines_read = (this->m_lexer).position.lines_read;
      local_148.chars_read_total._0_4_ = (undefined4)(this->m_lexer).position.chars_read_total;
      local_148.chars_read_total._4_4_ =
           *(undefined4 *)((long)&(this->m_lexer).position.chars_read_total + 4);
      local_148.chars_read_current_line._0_4_ =
           (undefined4)(this->m_lexer).position.chars_read_current_line;
      local_148.chars_read_current_line._4_4_ =
           *(undefined4 *)((long)&(this->m_lexer).position.chars_read_current_line + 4);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"value","");
      exception_message(&local_1b0,this,end_of_input,&local_1d0);
      parse_error::create<std::nullptr_t,_0>
                ((parse_error *)local_170,0x65,&local_148,(string *)&local_1b0,(void *)0x0);
      json_sax_dom_callback_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::parse_error<nlohmann::json_abi_v3_11_3::detail::parse_error>
                ((json_sax_dom_callback_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  *)local_110,sVar1,(string *)&local_190,(parse_error *)local_170);
      local_170[0] = &PTR__exception_005453c0;
      std::runtime_error::~runtime_error
                ((runtime_error *)((long)&((parse_error *)local_170)->super_exception + 0x10));
      std::exception::~exception((exception *)local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (local_98 == false) {
    if ((result->m_data).m_type != discarded) goto LAB_004098e4;
    (result->m_data).m_type = null;
    this_00 = &local_48;
    local_48.m_type = discarded;
  }
  else {
    local_38.m_type = (result->m_data).m_type;
    (result->m_data).m_type = discarded;
    this_00 = &local_38;
  }
  jVar2 = (result->m_data).m_value;
  (result->m_data).m_value.object = (object_t *)0x0;
  this_00->m_value = jVar2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(this_00);
LAB_004098e4:
  json_sax_dom_callback_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::~json_sax_dom_callback_parser
            ((json_sax_dom_callback_parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              *)local_110);
  return;
}

Assistant:

void parse(const bool strict, BasicJsonType& result)
    {
        if (callback)
        {
            json_sax_dom_callback_parser<BasicJsonType> sdp(result, callback, allow_exceptions);
            sax_parse_internal(&sdp);

            // in strict mode, input must be completely read
            if (strict && (get_token() != token_type::end_of_input))
            {
                sdp.parse_error(m_lexer.get_position(),
                                m_lexer.get_token_string(),
                                parse_error::create(101, m_lexer.get_position(),
                                                    exception_message(token_type::end_of_input, "value"), nullptr));
            }

            // in case of an error, return discarded value
            if (sdp.is_errored())
            {
                result = value_t::discarded;
                return;
            }

            // set top-level value to null if it was discarded by the callback
            // function
            if (result.is_discarded())
            {
                result = nullptr;
            }
        }
        else
        {
            json_sax_dom_parser<BasicJsonType> sdp(result, allow_exceptions);
            sax_parse_internal(&sdp);

            // in strict mode, input must be completely read
            if (strict && (get_token() != token_type::end_of_input))
            {
                sdp.parse_error(m_lexer.get_position(),
                                m_lexer.get_token_string(),
                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::end_of_input, "value"), nullptr));
            }

            // in case of an error, return discarded value
            if (sdp.is_errored())
            {
                result = value_t::discarded;
                return;
            }
        }

        result.assert_invariant();
    }